

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Command * __thiscall
Catch::CommandParser::find(Command *__return_storage_ptr__,CommandParser *this,string *arg)

{
  char *__s;
  bool bVar1;
  ulong uVar2;
  allocator<char> local_81;
  string local_80;
  ulong local_60;
  size_t i;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *arg_local;
  CommandParser *this_local;
  
  local_20 = arg;
  arg_local = (string *)this;
  this_local = (CommandParser *)__return_storage_ptr__;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    for (local_60 = 1; local_60 < this->m_argc; local_60 = local_60 + 1) {
      bVar1 = std::operator==(this->m_argv[local_60],local_20);
      if (bVar1) {
        __s = this->m_argv[local_60];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
        getArgs(__return_storage_ptr__,this,&local_80,local_60 + 1);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator(&local_81);
        return __return_storage_ptr__;
      }
    }
    Command::Command(__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    getArgs(__return_storage_ptr__,this,&local_40,1);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Command find( const std::string& arg ) const {
            if( arg.empty() )
                return getArgs( "", 1 );
            else
                for( std::size_t i = 1; i < m_argc; ++i  )
                    if( m_argv[i] == arg )
                        return getArgs( m_argv[i], i+1 );
            return Command();
        }